

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O3

void __thiscall wasm::FunctionValidator::visitThrow(FunctionValidator *this,Throw *curr)

{
  size_t sVar1;
  Expression *curr_00;
  bool bVar2;
  Tag *pTVar3;
  size_t sVar4;
  Type *pTVar5;
  Type *pTVar6;
  ostringstream *poVar7;
  ostream *poVar8;
  ulong uVar9;
  Type *this_00;
  undefined1 local_48 [8];
  Iterator __begin1;
  
  ValidationInfo::shouldBeTrue<wasm::Throw*>
            (this->info,
             SUB41(((((this->
                      super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                      ).
                      super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      .
                      super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     .currModule)->features).features & 0x40) >> 6,0),curr,
             "throw requires exception-handling [--enable-exception-handling]",
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction);
  ValidationInfo::shouldBeEqual<wasm::Throw*,wasm::Type>
            (this->info,
             (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)50>).super_Expression.type.
                   id,(Type)0x1,curr,"throw\'s type must be unreachable",
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction);
  if (this->info->validateGlobally == true) {
    pTVar3 = Module::getTagOrNull
                       ((this->
                        super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                        ).
                        super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .
                        super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .currModule,(Name)(curr->tag).super_IString.str);
    bVar2 = ValidationInfo::shouldBeTrue<wasm::Throw*>
                      (this->info,pTVar3 != (Tag *)0x0,curr,"throw\'s tag must exist",
                       (this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .currFunction);
    if (bVar2) {
      sVar1 = (curr->operands).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements;
      __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
           (size_t)&pTVar3->sig;
      sVar4 = wasm::Type::size((Type *)__begin1.
                                       super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                       .index);
      this_00 = (Type *)__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                        .index;
      bVar2 = ValidationInfo::shouldBeTrue<wasm::Throw*>
                        (this->info,sVar1 == sVar4,curr,"tag\'s param numbers must match",
                         (this->
                         super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                         ).
                         super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                         .
                         super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                         .currFunction);
      if (bVar2) {
        local_48 = (undefined1  [8])this_00;
        __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)0x0;
        pTVar5 = (Type *)wasm::Type::size(this_00);
        if (pTVar5 != (Type *)0x0) {
          uVar9 = 0;
          do {
            pTVar6 = wasm::Type::Iterator::operator*((Iterator *)local_48);
            if ((curr->operands).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                usedElements <= uVar9) {
              __assert_fail("index < usedElements",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                            ,0xbc,
                            "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                           );
            }
            curr_00 = (curr->operands).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                      data[uVar9];
            bVar2 = shouldBeSubType(this,(Type)(curr_00->type).id,(Type)pTVar6->id,curr_00,
                                    "tag param types must match");
            if ((!bVar2) && (this->info->quiet == false)) {
              poVar7 = ValidationInfo::getStream_abi_cxx11_
                                 (this->info,
                                  (this->
                                  super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                                  ).
                                  super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                  .
                                  super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                  .currFunction);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar7,"(on argument ",0xd);
              this_00 = (Type *)__begin1.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                                index;
              poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,")\n",2);
            }
            uVar9 = uVar9 + 1;
            __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                 (Type *)((long)&(__begin1.
                                  super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                 .parent)->id + 1);
          } while ((__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                    parent != pTVar5) || (local_48 != (undefined1  [8])this_00));
        }
      }
    }
  }
  return;
}

Assistant:

void FunctionValidator::visitThrow(Throw* curr) {
  shouldBeTrue(
    getModule()->features.hasExceptionHandling(),
    curr,
    "throw requires exception-handling [--enable-exception-handling]");
  shouldBeEqual(curr->type,
                Type(Type::unreachable),
                curr,
                "throw's type must be unreachable");
  if (!info.validateGlobally) {
    return;
  }
  auto* tag = getModule()->getTagOrNull(curr->tag);
  if (!shouldBeTrue(!!tag, curr, "throw's tag must exist")) {
    return;
  }
  if (!shouldBeTrue(curr->operands.size() == tag->sig.params.size(),
                    curr,
                    "tag's param numbers must match")) {
    return;
  }
  size_t i = 0;
  for (const auto& param : tag->sig.params) {
    if (!shouldBeSubType(curr->operands[i]->type,
                         param,
                         curr->operands[i],
                         "tag param types must match") &&
        !info.quiet) {
      getStream() << "(on argument " << i << ")\n";
    }
    ++i;
  }
}